

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PairingHeap.h
# Opt level: O1

Node * PairingHeap<std::pair<double,_int>_>::backJoin(Node *pre,Node *cur)

{
  double dVar1;
  double dVar2;
  Node *pNVar3;
  
  dVar1 = (cur->key).first;
  dVar2 = (pre->key).first;
  if ((dVar2 <= dVar1) && ((dVar2 < dVar1 || ((pre->key).second <= (cur->key).second)))) {
    pre->next = (Node *)0x0;
    pNVar3 = pre->ch;
    cur->next = pNVar3;
    if (pNVar3 != (Node *)0x0) {
      pNVar3->porp = cur;
    }
    cur->porp = pre;
    pre->ch = cur;
    return pre;
  }
  cur->porp = pre->porp;
  pNVar3 = cur->ch;
  pre->next = pNVar3;
  if (pNVar3 != (Node *)0x0) {
    pNVar3->porp = pre;
  }
  pre->porp = cur;
  cur->ch = pre;
  return cur;
}

Assistant:

static Node *backJoin(Node *pre, Node *cur)
	{
		if (cur->key < pre->key)
		{
			cur->porp = pre->porp;
			makeChildOf(pre, cur);
			return cur;
		}
		pre->next = nullptr;
		makeChildOf(cur, pre);
		return pre;
	}